

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O2

void __thiscall TApp_IniConfigurable_Test::TestBody(TApp_IniConfigurable_Test *this)

{
  App *this_00;
  bool bVar1;
  Option *pOVar2;
  ostream *poVar3;
  char *in_R9;
  bool value;
  AssertHelper local_310;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  AssertionResult gtest_ar_;
  TempFile tmpini;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  ofstream out;
  
  std::__cxx11::string::string((string *)&local_230,"TestIniTmp.ini",(allocator *)&out);
  TempFile::TempFile(&tmpini,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"--config",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_270,(string *)&tmpini);
  std::__cxx11::string::string((string *)&local_290,"Read an ini file",(allocator *)&gtest_ar_);
  this_00 = &(this->super_TApp).app;
  CLI::App::set_config(this_00,&local_250,&local_270,&local_290,false);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_2b0,"--val",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_2d0,"",(allocator *)&gtest_ar_);
  pOVar2 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(this_00,&local_2b0,&value,&local_2d0);
  (pOVar2->super_OptionBase<CLI::Option>).configurable_ = true;
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::ofstream::ofstream(&out,(string *)&tmpini,_S_out);
  poVar3 = std::operator<<((ostream *)&out,"[default]");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&out,"val=1");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ofstream::~ofstream(&out);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
  }
  else {
    testing::Message::Message((Message *)&out);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x18c,"Expected: run() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&out);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&out);
  }
  gtest_ar_.success_ = value;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (value == false) {
    testing::Message::Message((Message *)&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&out,(internal *)&gtest_ar_,(AssertionResult *)"value","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x18d,_out);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    std::__cxx11::string::~string((string *)&out);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_308);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  TempFile::~TempFile(&tmpini);
  return;
}

Assistant:

TEST_F(TApp, IniConfigurable) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);
    bool value;
    app.add_flag("--val", value)->configurable(true);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "val=1" << std::endl;
    }

    EXPECT_NO_THROW(run());
    EXPECT_TRUE(value);
}